

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarView::mouseDoubleClickEvent(QCalendarView *this,QMouseEvent *event)

{
  bool bVar1;
  int iVar2;
  QCalendarModel *pQVar3;
  QStyle *pQVar4;
  QAbstractItemView *in_RSI;
  QDate *in_RDI;
  long in_FS_OFFSET;
  QMouseEvent *in_stack_00000008;
  QCalendarModel *calendarModel;
  QDate date;
  QWidget *in_stack_ffffffffffffffc8;
  QCalendarView *this_00;
  
  this_00 = *(QCalendarView **)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model(in_RSI);
  pQVar3 = qobject_cast<QtPrivate::QCalendarModel*>((QObject *)0x51aa37);
  if (pQVar3 == (QCalendarModel *)0x0) {
    QAbstractItemView::mouseDoubleClickEvent((QAbstractItemView *)calendarModel,in_stack_00000008);
  }
  else if ((in_RDI[5].jd & 1) == 0) {
    handleMouseEvent(this_00,(QMouseEvent *)&DAT_aaaaaaaaaaaaaaaa);
    *(undefined1 *)((long)&in_RDI[5].jd + 1) = 0;
    bVar1 = ::operator==(in_RDI,(QDate *)in_stack_ffffffffffffffc8);
    if (bVar1) {
      pQVar4 = QWidget::style(in_stack_ffffffffffffffc8);
      iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x3d,0,in_RDI);
      if (iVar2 == 0) {
        editingFinished((QCalendarView *)0x51aae1);
      }
    }
  }
  if (*(QCalendarView **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarView::mouseDoubleClickEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseDoubleClickEvent(event);
        return;
    }

    if (readOnly)
        return;

    QDate date = handleMouseEvent(event);
    validDateClicked = false;
    if (date == calendarModel->m_date &&
        !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this)) {
        emit editingFinished();
    }
}